

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterLoadRowid(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  Fts5Index *in_RSI;
  long in_RDI;
  i64 iOff;
  u8 *a;
  long local_20;
  Fts5SegIter *pIter_00;
  
  pIter_00 = (Fts5SegIter *)**(undefined8 **)&in_RSI->nWorkUnit;
  local_20 = *(long *)&in_RSI->nPendingData;
  while( true ) {
    if (local_20 < *(int *)(*(long *)&in_RSI->nWorkUnit + 0xc)) {
      bVar1 = sqlite3Fts5GetVarint
                        ((uchar *)((long)&pIter_00->pSeg + local_20),(u64 *)&in_RSI->pIdxSelect);
      *(ulong *)&in_RSI->nPendingData = (ulong)bVar1 + local_20;
      return;
    }
    fts5SegIterNextPage(in_RSI,pIter_00);
    if (*(long *)&in_RSI->nWorkUnit == 0) break;
    local_20 = 4;
    pIter_00 = (Fts5SegIter *)**(undefined8 **)&in_RSI->nWorkUnit;
  }
  if (*(int *)(in_RDI + 0x3c) != 0) {
    return;
  }
  *(undefined4 *)(in_RDI + 0x3c) = 0x10b;
  return;
}

Assistant:

static void fts5SegIterLoadRowid(Fts5Index *p, Fts5SegIter *pIter){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  i64 iOff = pIter->iLeafOffset;

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( pIter->pLeaf==0 ){
      if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
      return;
    }
    iOff = 4;
    a = pIter->pLeaf->p;
  }
  iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&pIter->iRowid);
  pIter->iLeafOffset = iOff;
}